

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O1

void __thiscall NNTreeImpl::repair(NNTreeImpl *this)

{
  QPDFObjectHandle *this_00;
  undefined8 uVar1;
  string *psVar2;
  _List_node_base *p_Var3;
  long *plVar4;
  QPDFObjectHandle new_node;
  iterator __begin1;
  NNTreeImpl repl;
  iterator __end1;
  undefined1 local_1c8 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  QPDFObjectHandle local_1a0;
  undefined1 local_190 [16];
  undefined1 local_180 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  QPDFObjectHandle local_130;
  NNTreeImpl local_120;
  NNTreeIterator local_f0;
  iterator local_90;
  
  QPDFObjectHandle::newDictionary();
  psVar2 = (string *)(*(code *)**(undefined8 **)this->details)();
  QPDFObjectHandle::newArray();
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_1c8,psVar2,(QPDFObjectHandle *)local_190);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
  }
  local_120.details = this->details;
  local_120.qpdf = this->qpdf;
  local_120.split_threshold = 0x20;
  local_120.oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_1c8._0_8_;
  local_120.oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_1c8._8_8_ + 8) = *(_Atomic_word *)(local_1c8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_1c8._8_8_ + 8) = *(_Atomic_word *)(local_1c8._8_8_ + 8) + 1;
    }
  }
  local_120.auto_repair = false;
  begin((iterator *)local_190,this);
  local_f0._vptr_NNTreeIterator = (_func_int **)&PTR__NNTreeIterator_002ee0f0;
  local_f0.impl = this;
  local_f0.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_f0.path;
  local_f0.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_f0.path;
  local_f0.path.
  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
  _M_impl._M_node._M_size = 0;
  local_f0.node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_f0.node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0.item_number = 0xffffffff;
  local_f0.ivalue.first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_f0.ivalue.first.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_f0.ivalue.second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c8._16_8_ = this;
  do {
    if ((local_180._40_4_ & local_f0.item_number) == 0xffffffff) {
LAB_0012eec9:
      NNTreeIterator::~NNTreeIterator(&local_f0);
      NNTreeIterator::~NNTreeIterator((NNTreeIterator *)local_190);
      local_190._0_8_ = (element_type *)local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"/Kids","");
      local_f0._vptr_NNTreeIterator = (_func_int **)&local_f0.path;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/Kids","");
      QPDFObjectHandle::getKey(&local_130,(string *)local_1c8);
      this_00 = (QPDFObjectHandle *)(local_1c8._16_8_ + 0x18);
      QPDFObjectHandle::replaceKey(this_00,(string *)local_190,&local_130);
      if (local_130.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_130.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *)
          local_f0._vptr_NNTreeIterator != &local_f0.path) {
        operator_delete(local_f0._vptr_NNTreeIterator,
                        (ulong)((long)&(((_List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                                          *)&(local_f0.path.
                                              super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                                              ._M_impl._M_node.super__List_node_base._M_next)->
                                             _M_next)->_M_impl)._M_node.super__List_node_base.
                                       _M_next + 1));
      }
      uVar1 = local_1c8._16_8_;
      if ((element_type *)local_190._0_8_ != (element_type *)local_180) {
        operator_delete((void *)local_190._0_8_,(ulong)(local_180._0_8_ + 1));
      }
      psVar2 = (string *)(**(code **)**(undefined8 **)uVar1)();
      (**(code **)**(undefined8 **)uVar1)();
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_190,(string *)local_1c8);
      QPDFObjectHandle::replaceKey(this_00,psVar2,(QPDFObjectHandle *)local_190);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
      }
      if (local_120.oh.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_120.oh.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
      }
      return;
    }
    if (local_180._16_8_ ==
        local_f0.path.
        super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
        _M_impl._M_node._M_size) {
      p_Var3 = (_List_node_base *)&local_f0.path;
      plVar4 = (long *)local_180;
      do {
        plVar4 = (long *)*plVar4;
        if (plVar4 == (long *)local_180) {
          if (local_180._40_4_ == local_f0.item_number) goto LAB_0012eec9;
          break;
        }
        p_Var3 = (((_List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                    *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (*(int *)(plVar4 + 4) == *(int *)(p_Var3 + 2));
    }
    NNTreeIterator::updateIValue((NNTreeIterator *)local_190,false);
    local_1a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_180._48_8_;
    local_1a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_148._M_pi;
    if (local_148._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_148._M_pi)->_M_use_count = (local_148._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_148._M_pi)->_M_use_count = (local_148._M_pi)->_M_use_count + 1;
      }
    }
    local_1c8._24_8_ = local_140._M_pi;
    local_1a8 = local_138._M_pi;
    if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_138._M_pi)->_M_use_count = (local_138._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_138._M_pi)->_M_use_count = (local_138._M_pi)->_M_use_count + 1;
      }
    }
    insert(&local_90,&local_120,&local_1a0,(QPDFObjectHandle *)(local_1c8 + 0x18));
    NNTreeIterator::~NNTreeIterator(&local_90);
    if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8);
    }
    if (local_1a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    NNTreeIterator::increment((NNTreeIterator *)local_190,false);
  } while( true );
}

Assistant:

void
NNTreeImpl::repair()
{
    auto new_node = QPDFObjectHandle::newDictionary();
    new_node.replaceKey(details.itemsKey(), QPDFObjectHandle::newArray());
    NNTreeImpl repl(details, qpdf, new_node, false);
    for (auto const& i: *this) {
        repl.insert(i.first, i.second);
    }
    this->oh.replaceKey("/Kids", new_node.getKey("/Kids"));
    this->oh.replaceKey(details.itemsKey(), new_node.getKey(details.itemsKey()));
}